

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlAddAttributeDecl(void)

{
  int iVar1;
  xmlAttributeType val;
  xmlAttributeDefault val_00;
  int iVar2;
  xmlValidCtxtPtr val_01;
  xmlDtdPtr val_02;
  xmlChar *val_03;
  xmlChar *val_04;
  xmlChar *val_05;
  xmlChar *val_06;
  xmlAttributePtr val_07;
  int local_94;
  int n_tree;
  xmlEnumerationPtr tree;
  int n_defaultValue;
  xmlChar *defaultValue;
  int n_def;
  xmlAttributeDefault def;
  int n_type;
  xmlAttributeType type;
  int n_ns;
  xmlChar *ns;
  int n_name;
  xmlChar *name;
  int n_elem;
  xmlChar *elem;
  int n_dtd;
  xmlDtdPtr dtd;
  int n_ctxt;
  xmlValidCtxtPtr ctxt;
  xmlAttributePtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (dtd._4_4_ = 0; (int)dtd._4_4_ < 2; dtd._4_4_ = dtd._4_4_ + 1) {
    for (elem._4_4_ = 0; (int)elem._4_4_ < 3; elem._4_4_ = elem._4_4_ + 1) {
      for (name._4_4_ = 0; (int)name._4_4_ < 5; name._4_4_ = name._4_4_ + 1) {
        for (ns._4_4_ = 0; (int)ns._4_4_ < 5; ns._4_4_ = ns._4_4_ + 1) {
          for (n_type = 0; n_type < 5; n_type = n_type + 1) {
            for (n_def = 0; n_def < 4; n_def = n_def + 1) {
              for (defaultValue._4_4_ = 0; (int)defaultValue._4_4_ < 4;
                  defaultValue._4_4_ = defaultValue._4_4_ + 1) {
                for (tree._4_4_ = 0; (int)tree._4_4_ < 5; tree._4_4_ = tree._4_4_ + 1) {
                  for (local_94 = 0; local_94 < 1; local_94 = local_94 + 1) {
                    iVar1 = xmlMemBlocks();
                    val_01 = gen_xmlValidCtxtPtr(dtd._4_4_,0);
                    val_02 = gen_xmlDtdPtr(elem._4_4_,1);
                    val_03 = gen_const_xmlChar_ptr(name._4_4_,2);
                    val_04 = gen_const_xmlChar_ptr(ns._4_4_,3);
                    val_05 = gen_const_xmlChar_ptr(n_type,4);
                    val = gen_xmlAttributeType(n_def,5);
                    val_00 = gen_xmlAttributeDefault(defaultValue._4_4_,6);
                    val_06 = gen_const_xmlChar_ptr(tree._4_4_,7);
                    val_07 = (xmlAttributePtr)
                             xmlAddAttributeDecl(val_01,val_02,val_03,val_04,val_05,val,val_00,
                                                 val_06,0);
                    desret_xmlAttributePtr(val_07);
                    call_tests = call_tests + 1;
                    des_xmlValidCtxtPtr(dtd._4_4_,val_01,0);
                    des_xmlDtdPtr(elem._4_4_,val_02,1);
                    des_const_xmlChar_ptr(name._4_4_,val_03,2);
                    des_const_xmlChar_ptr(ns._4_4_,val_04,3);
                    des_const_xmlChar_ptr(n_type,val_05,4);
                    des_xmlAttributeType(n_def,val,5);
                    des_xmlAttributeDefault(defaultValue._4_4_,val_00,6);
                    des_const_xmlChar_ptr(tree._4_4_,val_06,7);
                    xmlResetLastError();
                    iVar2 = xmlMemBlocks();
                    if (iVar1 != iVar2) {
                      iVar2 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlAddAttributeDecl",
                             (ulong)(uint)(iVar2 - iVar1));
                      ret_val._4_4_ = ret_val._4_4_ + 1;
                      printf(" %d",(ulong)dtd._4_4_);
                      printf(" %d",(ulong)elem._4_4_);
                      printf(" %d",(ulong)name._4_4_);
                      printf(" %d",(ulong)ns._4_4_);
                      printf(" %d",(ulong)(uint)n_type);
                      printf(" %d",(ulong)(uint)n_def);
                      printf(" %d",(ulong)defaultValue._4_4_);
                      printf(" %d",(ulong)tree._4_4_);
                      printf(" %d");
                      printf("\n");
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlAddAttributeDecl(void) {
    int test_ret = 0;

    int mem_base;
    xmlAttributePtr ret_val;
    xmlValidCtxtPtr ctxt; /* the validation context */
    int n_ctxt;
    xmlDtdPtr dtd; /* pointer to the DTD */
    int n_dtd;
    xmlChar * elem; /* the element name */
    int n_elem;
    xmlChar * name; /* the attribute name */
    int n_name;
    xmlChar * ns; /* the attribute namespace prefix */
    int n_ns;
    xmlAttributeType type; /* the attribute type */
    int n_type;
    xmlAttributeDefault def; /* the attribute default type */
    int n_def;
    xmlChar * defaultValue; /* the attribute default value */
    int n_defaultValue;
    xmlEnumerationPtr tree; /* if it's an enumeration, the associated list */
    int n_tree;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlValidCtxtPtr;n_ctxt++) {
    for (n_dtd = 0;n_dtd < gen_nb_xmlDtdPtr;n_dtd++) {
    for (n_elem = 0;n_elem < gen_nb_const_xmlChar_ptr;n_elem++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_ns = 0;n_ns < gen_nb_const_xmlChar_ptr;n_ns++) {
    for (n_type = 0;n_type < gen_nb_xmlAttributeType;n_type++) {
    for (n_def = 0;n_def < gen_nb_xmlAttributeDefault;n_def++) {
    for (n_defaultValue = 0;n_defaultValue < gen_nb_const_xmlChar_ptr;n_defaultValue++) {
    for (n_tree = 0;n_tree < gen_nb_xmlEnumerationPtr;n_tree++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlValidCtxtPtr(n_ctxt, 0);
        dtd = gen_xmlDtdPtr(n_dtd, 1);
        elem = gen_const_xmlChar_ptr(n_elem, 2);
        name = gen_const_xmlChar_ptr(n_name, 3);
        ns = gen_const_xmlChar_ptr(n_ns, 4);
        type = gen_xmlAttributeType(n_type, 5);
        def = gen_xmlAttributeDefault(n_def, 6);
        defaultValue = gen_const_xmlChar_ptr(n_defaultValue, 7);
        tree = gen_xmlEnumerationPtr(n_tree, 8);

        ret_val = xmlAddAttributeDecl(ctxt, dtd, (const xmlChar *)elem, (const xmlChar *)name, (const xmlChar *)ns, type, def, (const xmlChar *)defaultValue, tree);
        desret_xmlAttributePtr(ret_val);
        call_tests++;
        des_xmlValidCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlDtdPtr(n_dtd, dtd, 1);
        des_const_xmlChar_ptr(n_elem, (const xmlChar *)elem, 2);
        des_const_xmlChar_ptr(n_name, (const xmlChar *)name, 3);
        des_const_xmlChar_ptr(n_ns, (const xmlChar *)ns, 4);
        des_xmlAttributeType(n_type, type, 5);
        des_xmlAttributeDefault(n_def, def, 6);
        des_const_xmlChar_ptr(n_defaultValue, (const xmlChar *)defaultValue, 7);
        des_xmlEnumerationPtr(n_tree, tree, 8);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlAddAttributeDecl",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_dtd);
            printf(" %d", n_elem);
            printf(" %d", n_name);
            printf(" %d", n_ns);
            printf(" %d", n_type);
            printf(" %d", n_def);
            printf(" %d", n_defaultValue);
            printf(" %d", n_tree);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}